

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

char * ucnv_getName_63(UConverter *converter,UErrorCode *err)

{
  UBool UVar1;
  char *temp;
  UErrorCode *err_local;
  UConverter *converter_local;
  
  UVar1 = U_FAILURE(*err);
  if (UVar1 == '\0') {
    if ((converter->sharedData->impl->getName == (UConverterGetName)0x0) ||
       (converter_local = (UConverter *)(*converter->sharedData->impl->getName)(converter),
       converter_local == (UConverter *)0x0)) {
      converter_local = (UConverter *)converter->sharedData->staticData->name;
    }
  }
  else {
    converter_local = (UConverter *)0x0;
  }
  return (char *)converter_local;
}

Assistant:

U_CAPI const char*   U_EXPORT2
ucnv_getName (const UConverter * converter, UErrorCode * err)
     
{
    if (U_FAILURE (*err))
        return NULL;
    if(converter->sharedData->impl->getName){
        const char* temp= converter->sharedData->impl->getName(converter);
        if(temp)
            return temp;
    }
    return converter->sharedData->staticData->name;
}